

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::updateHandle
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  btVector3 *in_RCX;
  unsigned_short *in_RDX;
  unsigned_short in_SI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  undefined8 in_R8;
  btAxisSweep3Internal<unsigned_short> *unaff_retaddr;
  unsigned_short in_stack_0000000a;
  int dmax;
  int dmin;
  unsigned_short emax;
  unsigned_short emin;
  int axis;
  unsigned_short max [3];
  unsigned_short min [3];
  Handle *pHandle;
  int local_40;
  ushort local_3c [6];
  Handle *local_30;
  undefined6 in_stack_fffffffffffffff0;
  btAxisSweep3Internal<unsigned_short> *pbVar4;
  
  pbVar4 = in_RDI;
  local_30 = getHandle(in_RDI,in_SI);
  quantize((btAxisSweep3Internal<unsigned_short> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDX,
           in_RCX,(int)((ulong)in_R8 >> 0x20));
  quantize((btAxisSweep3Internal<unsigned_short> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDX,
           in_RCX,(int)((ulong)in_R8 >> 0x20));
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    uVar1 = local_30->m_maxEdges[local_40];
    iVar2 = (uint)local_3c[(long)local_40 + 3] -
            (uint)in_RDI->m_pEdges[local_40][local_30->m_maxEdges[(long)local_40 + -3]].m_pos;
    iVar3 = (uint)local_3c[local_40] - (uint)in_RDI->m_pEdges[local_40][uVar1].m_pos;
    in_RDI->m_pEdges[local_40][local_30->m_maxEdges[(long)local_40 + -3]].m_pos =
         local_3c[(long)local_40 + 3];
    in_RDI->m_pEdges[local_40][uVar1].m_pos = local_3c[local_40];
    if (iVar2 < 0) {
      sortMinDown((btAxisSweep3Internal<unsigned_short> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),(unsigned_short)((ulong)in_RDX >> 0x10),
                  (btDispatcher *)in_RCX,SUB81((ulong)in_R8 >> 0x38,0));
    }
    if (0 < iVar3) {
      sortMaxUp(_dmin,dmax,in_stack_0000000a,(btDispatcher *)unaff_retaddr,
                SUB81((ulong)pbVar4 >> 0x38,0));
    }
    if (0 < iVar2) {
      sortMinUp(_dmin,dmax,in_stack_0000000a,(btDispatcher *)unaff_retaddr,
                SUB81((ulong)pbVar4 >> 0x38,0));
    }
    if (iVar3 < 0) {
      sortMaxDown(unaff_retaddr,(int)((ulong)pbVar4 >> 0x20),(unsigned_short)((ulong)pbVar4 >> 0x10)
                  ,(btDispatcher *)CONCAT26(in_SI,in_stack_fffffffffffffff0),
                  SUB81((ulong)in_RDX >> 0x38,0));
    }
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}